

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O3

void EverCrypt_HKDF_expand
               (Spec_Hash_Definitions_hash_alg a,uint8_t *okm,uint8_t *prk,uint32_t prklen,
               uint8_t *info,uint32_t infolen,uint32_t len)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  undefined4 in_register_0000000c;
  uint8_t *data;
  uint8_t *data_00;
  uint32_t extraout_EDX;
  ulong __n;
  uint uVar6;
  undefined7 in_register_00000039;
  ulong uVar7;
  void *pvVar8;
  uint32_t data_len;
  undefined4 in_register_0000008c;
  ulong uVar9;
  uint8_t uVar10;
  int iVar11;
  uint32_t uVar12;
  ulong uVar13;
  long lVar14;
  uint8_t *dst;
  undefined8 uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  undefined8 uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  uint8_t *puStack_50;
  void *pvStack_48;
  uint32_t uStack_40;
  uint uStack_3c;
  ulong __n_00;
  
  uVar9 = CONCAT44(in_register_0000008c,infolen);
  pvVar8 = (void *)CONCAT44(in_register_0000000c,prklen);
  uVar6 = (int)CONCAT71(in_register_00000039,a) - 1;
  uVar5 = (ulong)uVar6;
  uVar7 = uVar5;
  if (uVar6 < 7) {
    uVar7 = (long)&switchD_00176446::switchdataD_001dc728 +
            (long)(int)(&switchD_00176446::switchdataD_001dc728)[uVar5];
    switch(uVar5) {
    case 0:
      expand_sha2_256(okm,prk,prklen,info,infolen,len);
      return;
    case 1:
      expand_sha2_384(okm,prk,prklen,info,infolen,len);
      return;
    case 2:
      expand_sha2_512(okm,prk,prklen,info,infolen,len);
      return;
    case 3:
      expand_sha1(okm,prk,prklen,info,infolen,len);
      return;
    case 5:
      expand_blake2s(okm,prk,prklen,info,infolen,len);
      return;
    case 6:
      expand_blake2b(okm,prk,prklen,info,infolen,len);
      return;
    }
  }
  EverCrypt_HKDF_expand_cold_1();
  __n_00 = (ulong)info & 0xffffffff;
  iVar11 = (int)info;
  uVar5 = uVar9 & 0xffffffff;
  __n = (ulong)(iVar11 + 0x15);
  uVar13 = __n + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar13;
  dst = (uint8_t *)((long)&uStack_80 + lVar1);
  uStack_68 = uVar7;
  uStack_60 = __n;
  uStack_58 = uVar9;
  puStack_50 = okm;
  pvStack_48 = pvVar8;
  uStack_40 = extraout_EDX;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x176532;
  memset(dst,0,__n);
  pvVar8 = pvStack_48;
  uVar7 = uStack_58;
  data_00 = (uint8_t *)((long)&uStack_70 + (4 - uVar13));
  pvStack_48 = (void *)__n_00;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x176553;
  memcpy(data_00,pvVar8,__n_00);
  uVar6 = (uint)uVar7;
  if (uVar6 < 0x14) {
    uStack_3c = (int)(uVar5 / 0x14) * 0x14;
    if (uVar6 <= uStack_3c) {
      return;
    }
    data_00[(long)pvStack_48] = (char)(uVar5 / 0x14) + '\x01';
  }
  else {
    uStack_3c = iVar11 + 1;
    uStack_70 = (ulong)(uint)((int)(uVar5 / 0x14) * 4);
    lVar2 = uStack_70 * 5;
    uVar10 = '\x01';
    lVar14 = 0;
    uStack_80 = __n_00;
    uStack_78 = uVar5 / 0x14;
    do {
      data_00[(long)pvStack_48] = uVar10;
      uVar12 = uStack_40;
      puVar4 = puStack_50;
      data = data_00;
      data_len = uStack_3c;
      if (lVar14 != 0) {
        data = dst;
        data_len = (uint32_t)uStack_60;
      }
      *(undefined8 *)((long)&uStack_88 + lVar1) = 0x1765d8;
      EverCrypt_HMAC_compute_sha1(dst,puVar4,uVar12,data,data_len);
      *(undefined4 *)(uStack_68 + 0x10 + lVar14) = *(undefined4 *)((long)&uStack_70 + lVar1);
      uVar3 = *(undefined8 *)((long)&uStack_78 + lVar1);
      *(undefined8 *)(uStack_68 + lVar14) = *(undefined8 *)dst;
      ((undefined8 *)(uStack_68 + lVar14))[1] = uVar3;
      lVar14 = lVar14 + 0x14;
      uVar10 = uVar10 + '\x01';
    } while (lVar2 != lVar14);
    uStack_3c = (int)uStack_70 * 5;
    uVar6 = (uint)uStack_58;
    iVar11 = (int)uStack_80;
    if (uVar6 <= uStack_3c) {
      return;
    }
    data_00[(long)pvStack_48] = (char)uStack_78 + '\x01';
    if (0x13 < uVar6) {
      uVar12 = (uint32_t)uStack_60;
      data_00 = dst;
      goto LAB_0017664a;
    }
  }
  uVar12 = iVar11 + 1;
LAB_0017664a:
  puVar4 = puStack_50;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x17664f;
  EverCrypt_HMAC_compute_sha1(dst,puVar4,uStack_40,data_00,uVar12);
  pvVar8 = (void *)(uStack_68 + uStack_3c);
  uVar6 = uVar6 - uStack_3c;
  *(undefined8 *)((long)&uStack_88 + lVar1) = 0x176669;
  memcpy(pvVar8,dst,(ulong)uVar6);
  return;
}

Assistant:

void
EverCrypt_HKDF_expand(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        expand_sha1(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        expand_sha2_256(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        expand_sha2_384(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        expand_sha2_512(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        expand_blake2s(okm, prk, prklen, info, infolen, len);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        expand_blake2b(okm, prk, prklen, info, infolen, len);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}